

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  pointer *this;
  value_type vVar1;
  double dVar2;
  double dVar3;
  reference pvVar4;
  reference pvVar5;
  ostream *poVar6;
  vector<double,_std::allocator<double>_> *this_00;
  double extraout_XMM0_Qa;
  int local_324;
  ostream local_320 [4];
  int i_4;
  ofstream file;
  double temp_1;
  int j;
  int i_3;
  double error;
  value_type local_100;
  undefined1 local_f8 [8];
  vector<double,_std::allocator<double>_> x_aux;
  int i_2;
  double temp;
  double two_h_x_l;
  value_type vStack_c0;
  int i_1;
  int local_b8;
  allocator<double> local_b1;
  int i;
  undefined1 local_a8 [8];
  vector<double,_std::allocator<double>_> t;
  allocator<double> local_79;
  value_type local_78;
  undefined1 local_70 [8];
  vector<double,_std::allocator<double>_> c;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  A;
  double q_w;
  double lambda;
  double t_f;
  double h;
  double dy;
  double dx;
  
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage);
  local_78 = 0.0;
  std::allocator<double>::allocator(&local_79);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_70,0x18,&local_78,&local_79);
  std::allocator<double>::~allocator(&local_79);
  _i = 200.0;
  std::allocator<double>::allocator(&local_b1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_a8,0x18,(value_type *)&i,&local_b1);
  std::allocator<double>::~allocator(&local_b1);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage,0x18);
  for (local_b8 = 0; local_b8 < 0x18; local_b8 = local_b8 + 1) {
    pvVar4 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,(long)local_b8);
    vStack_c0 = 0.0;
    std::vector<double,_std::allocator<double>_>::resize(pvVar4,0x18,&stack0xffffffffffffff40);
  }
  for (two_h_x_l._4_4_ = 0; two_h_x_l._4_4_ < 0x18; two_h_x_l._4_4_ = two_h_x_l._4_4_ + 1) {
    if ((((two_h_x_l._4_4_ % 6 != 0) && (two_h_x_l._4_4_ % 6 != 5)) && (two_h_x_l._4_4_ / 6 != 0))
       && (two_h_x_l._4_4_ / 6 != 3)) {
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,(long)two_h_x_l._4_4_);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (pvVar4,(long)(two_h_x_l._4_4_ + -1));
      *pvVar5 = 0.25;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,(long)two_h_x_l._4_4_);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (pvVar4,(long)(two_h_x_l._4_4_ + 1));
      *pvVar5 = 0.25;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,(long)two_h_x_l._4_4_);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (pvVar4,(long)(two_h_x_l._4_4_ + -6));
      *pvVar5 = 0.25;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,(long)two_h_x_l._4_4_);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (pvVar4,(long)(two_h_x_l._4_4_ + 6));
      *pvVar5 = 0.25;
    }
  }
  pvVar4 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,0xb);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,5);
  *pvVar5 = 0.24141630919814847;
  pvVar4 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,0xb);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,5);
  vVar1 = *pvVar5;
  pvVar4 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,0xb);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,0x11);
  *pvVar5 = vVar1;
  pvVar4 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,0xb);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,5);
  dVar2 = *pvVar5;
  pvVar4 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,0xb);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,10);
  *pvVar5 = dVar2 * 2.0;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_70,0xb);
  *pvVar5 = 0.8583690801851501;
  pvVar4 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,0xb);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,5);
  vVar1 = *pvVar5;
  pvVar4 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,0x11);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,0xb);
  *pvVar5 = vVar1;
  pvVar4 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,0xb);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,0x11);
  vVar1 = *pvVar5;
  pvVar4 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,0x11);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,0x17);
  *pvVar5 = vVar1;
  pvVar4 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,0xb);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,10);
  vVar1 = *pvVar5;
  pvVar4 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,0x11);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,0x10);
  *pvVar5 = vVar1;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_70,0xb);
  vVar1 = *pvVar5;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_70,0x11);
  *pvVar5 = vVar1;
  pvVar4 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,6);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,0);
  *pvVar5 = 0.25;
  pvVar4 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,6);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,0xc);
  *pvVar5 = 0.25;
  pvVar4 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,6);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,7);
  *pvVar5 = 0.5;
  pvVar4 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,0xc);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,6);
  *pvVar5 = 0.25;
  pvVar4 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,0xc);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,0x12);
  *pvVar5 = 0.25;
  pvVar4 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,0xc);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,0xd);
  *pvVar5 = 0.5;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_70,0);
  *pvVar5 = 200.0;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_70,1);
  *pvVar5 = 200.0;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_70,2);
  *pvVar5 = 200.0;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_70,3);
  *pvVar5 = 200.0;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_70,4);
  *pvVar5 = 200.0;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_70,5);
  *pvVar5 = 200.0;
  for (x_aux.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_ = 0x13;
      x_aux.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ < 0x17;
      x_aux.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           x_aux.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage._4_4_ + 1) {
    pvVar4 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,
                          (long)x_aux.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._4_4_);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (pvVar4,(long)(x_aux.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -6))
    ;
    *pvVar5 = 0.5;
    pvVar4 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,
                          (long)x_aux.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._4_4_);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (pvVar4,(long)(x_aux.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -1))
    ;
    *pvVar5 = 0.25;
    pvVar4 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,
                          (long)x_aux.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._4_4_);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (pvVar4,(long)(x_aux.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1));
    *pvVar5 = 0.25;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_70,
                        (long)x_aux.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage._4_4_);
    *pvVar5 = 1.3333333035310109;
  }
  this = &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage;
  pvVar4 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)this,0x12);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,0xc);
  *pvVar5 = 0.5;
  pvVar4 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)this,0x12);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,0x13);
  *pvVar5 = 0.5;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_70,0x12);
  *pvVar5 = 1.3333333035310109;
  pvVar4 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)this,0x17);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,0x16);
  *pvVar5 = 0.48283261839629693;
  pvVar4 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)this,0x17);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,0x16);
  vVar1 = *pvVar5;
  pvVar4 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)this,0x17);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,0x11);
  *pvVar5 = vVar1;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_70,0x17);
  *pvVar5 = 2.1459227004628754;
  local_100 = 0.0;
  std::allocator<double>::allocator((allocator<double> *)((long)&error + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_f8,0x18,&local_100,
             (allocator<double> *)((long)&error + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&error + 7));
  do {
    _j = 0.0;
    for (temp_1._4_4_ = 0; temp_1._4_4_ < 0x18; temp_1._4_4_ = temp_1._4_4_ + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_a8,(long)temp_1._4_4_);
      vVar1 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_f8,(long)temp_1._4_4_);
      *pvVar5 = vVar1;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_a8,(long)temp_1._4_4_);
      *pvVar5 = 0.0;
      for (temp_1._0_4_ = 0; temp_1._0_4_ < 0x18; temp_1._0_4_ = temp_1._0_4_ + 1) {
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,(long)temp_1._4_4_);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)temp_1._0_4_)
        ;
        dVar2 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_f8,(long)temp_1._0_4_);
        dVar3 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_a8,(long)temp_1._4_4_);
        *pvVar5 = dVar2 * dVar3 + *pvVar5;
      }
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_70,(long)temp_1._4_4_);
      dVar2 = *pvVar5;
      this_00 = (vector<double,_std::allocator<double>_> *)local_a8;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)temp_1._4_4_);
      *pvVar5 = *pvVar5 + dVar2;
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)local_f8,(long)temp_1._4_4_);
      std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)temp_1._4_4_);
      std::abs((int)this_00);
      if (_j < extraout_XMM0_Qa) {
        _j = extraout_XMM0_Qa;
      }
    }
  } while (0.0001 < _j);
  std::ofstream::ofstream(local_320);
  std::ofstream::open(local_320,"data.dat",0x10);
  std::operator<<(local_320,"# X Y Z\n");
  for (local_324 = 0; local_324 < 0x18; local_324 = local_324 + 1) {
    poVar6 = (ostream *)std::ostream::operator<<(local_320,(local_324 % 6) * 0x50);
    poVar6 = std::operator<<(poVar6," ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(local_324 / 6) * 0x50);
    poVar6 = std::operator<<(poVar6," ");
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_a8,(long)local_324);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar5);
    std::operator<<(poVar6,"\n");
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_320);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_f8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_a8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_70);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  return 0;
}

Assistant:

int main(){
  double dx = 0.08f, dy = 0.08f;
  double h = 40.0f, t_f = 25.0f, lambda = 45.0f, q_w = 1500;

  std::vector<std::vector<double> > A;
  std::vector<double> c(24,0);
  std::vector<double> t(24,200);
  A.resize(24);
  for (int i=0;i<24;i++){
    A[i].resize(24,0);
  }

  // Inner points
  for (int i=0;i<24;i++){
    if ((i%6 == 0) || (i%6 == 5)) continue;
    if ((i/6 == 0) || (i/6 == 3)) continue;
    A[i][i-1] = 0.25f;
    A[i][i+1] = 0.25f;
    A[i][i-6] = 0.25f;
    A[i][i+6] = 0.25f;
  }

  // Convection
  double two_h_x_l = 2.0f * h * dx / lambda;
  A[11][5] = 1.0f / (4.0f + two_h_x_l);
  A[11][17] = A[11][5];
  A[11][10] = 2 * A[11][5];
  c[11] = two_h_x_l / (4.0f + two_h_x_l) * t_f;
  A[17][11] = A[11][5];
  A[17][23] = A[11][17];
  A[17][16] = A[11][10];
  c[17] = c[11];

  // Insulation
  A[6][0] = 0.25f;
  A[6][12] = 0.25f;
  A[6][7] = 0.5f;
  A[12][6] = 0.25f;
  A[12][18] = 0.25f;
  A[12][13] = 0.5f;

  // I
  c[0] = 200.0f;
  c[1] = 200.0f;
  c[2] = 200.0f;
  c[3] = 200.0f;
  c[4] = 200.0f;
  c[5] = 200.0f;

  // II
  double temp = dx * q_w / lambda / 2;
  for (int i=19;i<23;i++){
    A[i][i-6] = 0.5f;
    A[i][i-1] = 0.25f;
    A[i][i+1] = 0.25f;
    c[i] = temp;
  }

  // half II + half iso
  A[18][12] = 0.5f;
  A[18][19] = 0.5f;
  c[18] = q_w * dx / lambda / 2;

  // half II + half III
  A[23][22] = 1.0f / (2.0 + h * dx / lambda);
  A[23][17] = A[23][22];
  c[23] = (q_w * dx / lambda + h * dx * t_f / lambda) / (2.0 + h * dx / lambda);


  // Gaussian Seidel Method
  std::vector<double> x_aux(24,0);
  double error;

  do {
    error = 0;
    for (int i=0;i<24;i++){
      x_aux[i] = t[i];
      t[i] = 0;
      for (int j=0;j<24;j++){
        t[i] += A[i][j] * x_aux[j];
      }
      t[i] += c[i];
      double temp = std::abs(x_aux[i] - t[i]);
      if (temp > error)
        error = temp;
    }
  } while (error>0.0001);

//  for (int i=0;i<24;i++){
//    std::cout<<t[i]<<" ";
//    if (i%6 == 5) std::cout<<std::endl;
//  }

  // To file
  std::ofstream file;
  file.open("data.dat");
  file<<"# X Y Z\n";
  for (int i=0;i<24;i++){
    file << i%6 * 80 << " " << i/6 * 80 << " " << t[i] << "\n";
  }
  file.close();

  return 0;
}